

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O0

string * __thiscall
glu::sl::ShaderParser::parseStringLiteral_abi_cxx11_
          (string *__return_storage_ptr__,ShaderParser *this,char *str)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  ostringstream local_1a8 [8];
  ostringstream o;
  char *pcStack_28;
  char endChar;
  char *p;
  char *str_local;
  ShaderParser *this_local;
  
  cVar1 = *str;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pcStack_28 = str + 1;
  while( true ) {
    bVar3 = false;
    if (*pcStack_28 != cVar1) {
      bVar3 = *pcStack_28 != '\0';
    }
    if (!bVar3) break;
    if (*pcStack_28 == '\\') {
      cVar2 = pcStack_28[1];
      if (cVar2 != '\0') {
        if (cVar2 == 'n') {
          std::operator<<((ostream *)local_1a8,'\n');
        }
        else if (cVar2 == 't') {
          std::operator<<((ostream *)local_1a8,'\t');
        }
        else {
          std::operator<<((ostream *)local_1a8,pcStack_28[1]);
        }
      }
      pcStack_28 = pcStack_28 + 2;
    }
    else {
      std::operator<<((ostream *)local_1a8,*pcStack_28);
      pcStack_28 = pcStack_28 + 1;
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string ShaderParser::parseStringLiteral (const char* str)
{
	const char*		p		= str;
	char			endChar = *p++;
	ostringstream	o;

	while (*p != endChar && *p)
	{
		if (*p == '\\')
		{
			switch (p[1])
			{
				case 0:		DE_ASSERT(DE_FALSE);	break;
				case 'n':	o << '\n';				break;
				case 't':	o << '\t';				break;
				default:	o << p[1];				break;
			}

			p += 2;
		}
		else
			o << *p++;
	}

	return o.str();
}